

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall
QTextStreamPrivate::putNumber(QTextStreamPrivate *this,qulonglong number,bool negative)

{
  QStringView string;
  bool bVar1;
  long lVar2;
  QLocalePrivate *pQVar3;
  undefined1 in_DL;
  long in_RSI;
  void *pvVar4;
  long in_RDI;
  long in_FS_OFFSET;
  uint unaff_retaddr;
  int base;
  QLocaleData *dd;
  uint flags;
  QString result;
  NumberFlags numberFlags;
  undefined4 in_stack_ffffffffffffff08;
  NumberFlag in_stack_ffffffffffffff0c;
  QLatin1StringView *in_stack_ffffffffffffff10;
  QString *in_stack_ffffffffffffff18;
  QChar c;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  int precision;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar5;
  undefined6 in_stack_ffffffffffffff38;
  byte bVar6;
  byte bVar7;
  int in_stack_ffffffffffffff48;
  int iVar8;
  uint uVar9;
  undefined3 in_stack_ffffffffffffff5c;
  uint uVar10;
  QChar local_7a;
  QLatin1StringView local_78;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_64;
  QString local_48;
  QFlagsStorageHelper<QLocale::NumberOption,_4> local_2c;
  undefined1 local_28 [12];
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_1c;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_18;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_14;
  QFlagsStorageHelper<QTextStream::NumberFlag,_4> local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = CONCAT13(in_DL,in_stack_ffffffffffffff5c) & 0x1ffffff;
  uVar9 = 0;
  local_c = *(undefined4 *)(in_RDI + 0x128);
  local_10.super_QFlagsStorage<QTextStream::NumberFlag>.i =
       (QFlagsStorage<QTextStream::NumberFlag>)
       QFlags<QTextStream::NumberFlag>::operator&
                 ((QFlags<QTextStream::NumberFlag> *)in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_10);
  if (bVar1) {
    uVar9 = uVar9 | 0x80;
  }
  local_14.super_QFlagsStorage<QTextStream::NumberFlag>.i =
       (QFlagsStorage<QTextStream::NumberFlag>)
       QFlags<QTextStream::NumberFlag>::operator&
                 ((QFlags<QTextStream::NumberFlag> *)in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
  bVar7 = 0;
  if (bVar1) {
    bVar7 = (byte)(uVar10 >> 0x18) ^ 0xff;
  }
  if ((bVar7 & 1) != 0) {
    uVar9 = uVar9 | 0x10;
  }
  local_18.super_QFlagsStorage<QTextStream::NumberFlag>.i =
       (QFlagsStorage<QTextStream::NumberFlag>)
       QFlags<QTextStream::NumberFlag>::operator&
                 ((QFlags<QTextStream::NumberFlag> *)in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_18);
  if (bVar1) {
    uVar9 = uVar9 | 0x100;
  }
  pvVar4 = (void *)0x10;
  local_1c.super_QFlagsStorage<QTextStream::NumberFlag>.i =
       (QFlagsStorage<QTextStream::NumberFlag>)
       QFlags<QTextStream::NumberFlag>::operator&
                 ((QFlags<QTextStream::NumberFlag> *)in_stack_ffffffffffffff10,
                  in_stack_ffffffffffffff0c);
  bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_1c);
  if (bVar1) {
    uVar9 = uVar9 | 0x40;
  }
  lVar2 = in_RDI + 0x130;
  QLocale::c(local_28,pvVar4);
  bVar1 = ::operator!=((QLocale *)in_stack_ffffffffffffff10,
                       (QLocale *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  bVar6 = 0;
  if (bVar1) {
    local_2c.super_QFlagsStorage<QLocale::NumberOption>.i =
         (QFlagsStorage<QLocale::NumberOption>)
         QLocale::numberOptions((QLocale *)in_stack_ffffffffffffff10);
    bVar1 = QFlags<QLocale::NumberOption>::testFlag
                      ((QFlags<QLocale::NumberOption> *)in_stack_ffffffffffffff10,
                       in_stack_ffffffffffffff0c);
    bVar6 = bVar1 ^ 0xff;
  }
  uVar5 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffff2c);
  QLocale::~QLocale((QLocale *)0x13fd1a);
  if ((uVar5 & 0x1000000) != 0) {
    uVar9 = uVar9 | 0x20;
  }
  pQVar3 = QSharedDataPointer<QLocalePrivate>::operator->
                     ((QSharedDataPointer<QLocalePrivate> *)in_stack_ffffffffffffff10);
  if (*(int *)(in_RDI + 0x114) == 0) {
    precision = 10;
  }
  else {
    precision = *(int *)(in_RDI + 0x114);
  }
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_48.d.size = -0x5555555555555556;
  iVar8 = precision;
  QLocaleData::unsLongLongToString
            ((QLocaleData *)CONCAT44(uVar10,uVar9),(qulonglong)pQVar3->m_data,precision,
             in_stack_ffffffffffffff48,(int)((ulong)in_RDI >> 0x20),unaff_retaddr);
  if ((uVar10 & 0x1000000) == 0) {
    in_stack_ffffffffffffff27 = false;
    if ((in_RSI == 0) && (in_stack_ffffffffffffff27 = false, iVar8 == 8)) {
      local_64.super_QFlagsStorage<QTextStream::NumberFlag>.i =
           (QFlagsStorage<QTextStream::NumberFlag>)
           QFlags<QTextStream::NumberFlag>::operator&
                     ((QFlags<QTextStream::NumberFlag> *)in_stack_ffffffffffffff10,
                      in_stack_ffffffffffffff0c);
      bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_64);
      in_stack_ffffffffffffff27 = false;
      if (bVar1) {
        local_78 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)in_stack_ffffffffffffff18,(size_t)in_stack_ffffffffffffff10);
        in_stack_ffffffffffffff27 =
             ::operator==(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      }
    }
    c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff18 >> 0x30);
    if ((bool)in_stack_ffffffffffffff27 != false) {
      QChar::QChar<char16_t,_true>(&local_7a,L'0');
      QString::prepend((QString *)in_stack_ffffffffffffff10,c);
    }
  }
  else {
    QLocale::negativeSign((QLocale *)in_stack_ffffffffffffff18);
    QString::prepend((QString *)in_stack_ffffffffffffff10,
                     (QString *)CONCAT44(in_stack_ffffffffffffff0c,uVar9));
    QString::~QString((QString *)0x13fe18);
  }
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),&local_48)
  ;
  string.m_size._0_6_ = in_stack_ffffffffffffff38;
  string.m_data = (storage_type_conflict *)lVar2;
  string.m_size._6_1_ = bVar6;
  string.m_size._7_1_ = bVar7;
  putString((QTextStreamPrivate *)CONCAT44(uVar5,precision),string,(bool)in_stack_ffffffffffffff27);
  QString::~QString((QString *)0x13ff1a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextStreamPrivate::putNumber(qulonglong number, bool negative)
{
    unsigned flags = 0;
    const QTextStream::NumberFlags numberFlags = params.numberFlags;
    if (numberFlags & QTextStream::ShowBase)
        flags |= QLocaleData::ShowBase;
    // ForceSign is irrelevant when we'll be including a sign in any case:
    if ((numberFlags & QTextStream::ForceSign) && !negative)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags & QTextStream::UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags & QTextStream::UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;

    // Group digits. For backward compatibility, we skip this for the C locale.
    if (locale != QLocale::c() && !locale.numberOptions().testFlag(QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;

    const QLocaleData *dd = locale.d->m_data;
    int base = params.integerBase ? params.integerBase : 10;
    QString result = dd->unsLongLongToString(number, -1, base, -1, flags);
    if (negative) {
        result.prepend(locale.negativeSign());
    } else if (number == 0 && base == 8 && params.numberFlags & QTextStream::ShowBase
               && result == "0"_L1) {
        // Workaround for backward compatibility - in octal form with ShowBase
        // flag set, zero should get its 0 prefix before its 0 value, but
        // QLocalePrivate only adds the prefix if the number doesn't start with
        // a zero.
        result.prepend(u'0');
    }
    putString(result, true);
}